

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_merge_sort_tree.cpp
# Opt level: O1

optional_ptr<duckdb::LocalSortState,_true> __thiscall
duckdb::WindowMergeSortTree::AddLocalSort(WindowMergeSortTree *this)

{
  _Head_base<0UL,_duckdb::LocalSortState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LocalSortState_*,_false> _Var2;
  int iVar3;
  LocalSortState *this_00;
  pointer this_01;
  type global_sort_state;
  pointer pGVar4;
  reference pvVar5;
  templated_unique_single_t local_sort;
  _Head_base<0UL,_duckdb::LocalSortState_*,_false> local_30;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar3 == 0) {
    this_00 = (LocalSortState *)operator_new(0xd0);
    LocalSortState::LocalSortState(this_00);
    local_30._M_head_impl = this_00;
    this_01 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
              ::operator->((unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                            *)&local_30);
    global_sort_state =
         unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
         operator*(&this->global_sort);
    pGVar4 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator->(&this->global_sort);
    LocalSortState::Initialize(this_01,global_sort_state,pGVar4->buffer_manager);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LocalSortState,std::default_delete<duckdb::LocalSortState>,true>,std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,std::default_delete<duckdb::LocalSortState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LocalSortState,std::default_delete<duckdb::LocalSortState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LocalSortState,std::default_delete<duckdb::LocalSortState>,true>,std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,std::default_delete<duckdb::LocalSortState>,true>>>
                *)&this->local_sorts,
               (unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                *)&local_30);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_true>
             ::back(&this->local_sorts);
    _Var2._M_head_impl = local_30._M_head_impl;
    _Var1._M_head_impl =
         (pvVar5->
         super_unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
         .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl;
    if (local_30._M_head_impl != (LocalSortState *)0x0) {
      LocalSortState::~LocalSortState(local_30._M_head_impl);
      operator_delete(_Var2._M_head_impl);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return (optional_ptr<duckdb::LocalSortState,_true>)_Var1._M_head_impl;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

optional_ptr<LocalSortState> WindowMergeSortTree::AddLocalSort() {
	lock_guard<mutex> local_sort_guard(lock);
	auto local_sort = make_uniq<LocalSortState>();
	local_sort->Initialize(*global_sort, global_sort->buffer_manager);
	local_sorts.emplace_back(std::move(local_sort));

	return local_sorts.back().get();
}